

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawSectorDump.hpp
# Opt level: O1

void __thiscall
Storage::MassStorage::RawSectorDump<512L>::RawSectorDump
          (RawSectorDump<512L> *this,string *file_name,long offset,long length)

{
  stat *psVar1;
  undefined8 *puVar2;
  
  (this->super_MassStorageDevice)._vptr_MassStorageDevice =
       (_func_int **)&PTR__RawSectorDump_005aae88;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  if (length == -1) {
    psVar1 = FileHolder::stats(&this->file_);
    length = psVar1->st_size;
  }
  this->file_size_ = length;
  this->file_start_ = offset;
  if ((length & 0x1ffU) == 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pthread_mutex_lock;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

RawSectorDump(const std::string &file_name, long offset = 0, long length = -1) :
			file_(file_name),
			file_size_((length == -1) ? long(file_.stats().st_size) : length),
			file_start_(offset)
		{
			// Is the file a multiple of sector_size bytes in size?
			if(file_size_ % sector_size) throw std::exception();
		}